

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.c
# Opt level: O2

void board_printKlondikeSolverDeck(Board *board)

{
  Spot *pSVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = 0;
  while (uVar3 = uVar4, uVar3 != 7) {
    for (iVar2 = 0; uVar4 = uVar3 + 1, iVar2 != 7; iVar2 = iVar2 + 1) {
      pSVar1 = board_spotGet(board,TABLEAU,(uchar)iVar2);
      if (uVar3 < pSVar1->cardsCount) {
        printf("%02d%d",(ulong)pSVar1->cards[uVar3]->rank,(ulong)(pSVar1->cards[uVar3]->suit + 1));
      }
    }
  }
  pSVar1 = board_spotGet(board,STOCK,'\0');
  for (uVar4 = (ulong)pSVar1->cardsCount; 0 < (long)uVar4; uVar4 = uVar4 - 1) {
    printf("%02d%d",(ulong)pSVar1->cards[uVar4 - 1]->rank,
           (ulong)(pSVar1->cards[uVar4 - 1]->suit + 1));
  }
  putchar(10);
  return;
}

Assistant:

void board_printKlondikeSolverDeck(Board * board)
{
	int i,j;
	Spot * spot;

	for(i=0;i<7;i++)
	{
		for(j=0;j<7;j++)
		{
			spot = board_spotGet(board, TABLEAU, j);
			if(spot->cardsCount>=(i+1))
				printf("%02d%d", spot->cards[i]->rank, spot->cards[i]->suit+1);
		}
	}

	spot = board_spotGet(board, STOCK, 0);
	for(i=spot->cardsCount-1;i>=0;i--)
	{
		printf("%02d%d", spot->cards[i]->rank, spot->cards[i]->suit+1);
	}

	printf("\n");
}